

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_appender_api.cpp
# Opt level: O3

void TestAppendingSingleDecimalValue<int>
               (int value,Value *expected_result,uint8_t width,uint8_t scale)

{
  SourceLineInfo *pSVar1;
  long lVar2;
  StringRef capturedExpression;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Connection_*,_false> _Var4;
  _Head_base<0UL,_duckdb::DuckDB_*,_false> _Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  DuckDB *this;
  type pDVar8;
  Connection *this_00;
  type pCVar9;
  _Head_base<0UL,_duckdb::Appender_*,_false> this_01;
  pointer pAVar10;
  uchar params_1;
  initializer_list<duckdb::Value> __l;
  AssertionHandler catchAssertionHandler;
  ExprLhs<bool> local_151;
  _Head_base<0UL,_duckdb::Appender_*,_false> local_150;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_148;
  _Head_base<0UL,_duckdb::Connection_*,_false> local_140;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_138;
  SourceLineInfo local_130;
  _Head_base<0UL,_duckdb::DuckDB_*,_false> local_120;
  AssertionHandler local_118;
  Value *local_d0;
  string local_c8 [2];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  StringRef local_50;
  StringRef local_40;
  
  this = (DuckDB *)operator_new(0x10);
  duckdb::DuckDB::DuckDB(this,(char *)0x0,(DBConfig *)0x0);
  local_120._M_head_impl = this;
  pDVar8 = duckdb::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                     ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
                      &local_120);
  this_00 = (Connection *)operator_new(0x20);
  local_d0 = expected_result;
  duckdb::Connection::Connection(this_00,pDVar8);
  local_150._M_head_impl = (Appender *)0x0;
  local_148._M_head_impl = (QueryResult *)0x0;
  local_c8[0]._M_dataplus._M_p = "REQUIRE";
  local_c8[0]._M_string_length = 7;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
  ;
  local_130.line = 0xf;
  local_140._M_head_impl = this_00;
  Catch::StringRef::StringRef
            (&local_40,
             "NO_FAIL((conn->Query(StringUtil::Format(\"CREATE TABLE decimals(i DECIMAL(%d,%d))\", width, scale))))"
            );
  capturedExpression.m_size = local_40.m_size;
  capturedExpression.m_start = local_40.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&local_118,(StringRef *)local_c8,&local_130,capturedExpression,Normal);
  params_1 = (uchar)local_40.m_size;
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             &local_140);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"CREATE TABLE decimals(i DECIMAL(%d,%d))","");
  duckdb::Exception::ConstructMessage<unsigned_char,unsigned_char>
            (local_c8,(Exception *)local_70,(string *)(ulong)width,scale,params_1);
  duckdb::Connection::Query((string *)&local_130);
  local_138._M_head_impl = (QueryResult *)local_130.file;
  local_130.file = (char *)0x0;
  local_151.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_138);
  Catch::AssertionHandler::handleExpr<bool>(&local_118,&local_151);
  if (local_138._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_138._M_head_impl + 8))();
  }
  local_138._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_130.file != (long *)0x0) {
    (**(code **)(*(long *)local_130.file + 8))();
  }
  local_130.file = (char *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8[0]._M_dataplus._M_p != &local_c8[0].field_2) {
    operator_delete(local_c8[0]._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  Catch::AssertionHandler::complete(&local_118);
  if (local_118.m_completed == false) {
    (*(local_118.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  pCVar9 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
           operator*((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                      *)&local_140);
  this_01._M_head_impl = (Appender *)operator_new(0x108);
  pSVar1 = &local_118.m_assertionInfo.lineInfo;
  local_118.m_assertionInfo.macroName.m_start = (char *)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"decimals","");
  duckdb::Appender::Appender(this_01._M_head_impl,pCVar9,(string *)&local_118);
  if ((SourceLineInfo *)local_118.m_assertionInfo.macroName.m_start != pSVar1) {
    operator_delete(local_118.m_assertionInfo.macroName.m_start);
  }
  if (local_150._M_head_impl != (Appender *)0x0) {
    lVar2 = *(long *)local_150._M_head_impl;
    local_150._M_head_impl = this_01._M_head_impl;
    (**(code **)(lVar2 + 8))();
    this_01._M_head_impl = local_150._M_head_impl;
  }
  local_150._M_head_impl = this_01._M_head_impl;
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_150
            );
  duckdb::BaseAppender::BeginRow();
  pAVar10 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
            operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                       &local_150);
  duckdb::BaseAppender::Append<int>((int)pAVar10);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_150
            );
  duckdb::BaseAppender::EndRow();
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)&local_150
            );
  duckdb::BaseAppender::Flush();
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             &local_140);
  local_118.m_assertionInfo.macroName.m_start = (char *)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SELECT * FROM decimals","");
  duckdb::Connection::Query((string *)local_c8);
  _Var6._M_p = local_c8[0]._M_dataplus._M_p;
  _Var3._M_head_impl = local_148._M_head_impl;
  local_c8[0]._M_dataplus._M_p = (pointer)0x0;
  local_148._M_head_impl = (QueryResult *)_Var6._M_p;
  if (_Var3._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
    if ((long *)local_c8[0]._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8[0]._M_dataplus._M_p + 8))();
    }
  }
  local_c8[0]._M_dataplus._M_p = (pointer)0x0;
  if ((SourceLineInfo *)local_118.m_assertionInfo.macroName.m_start != pSVar1) {
    operator_delete(local_118.m_assertionInfo.macroName.m_start);
  }
  local_c8[0]._M_dataplus._M_p = "REQUIRE";
  local_c8[0]._M_string_length = 7;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
  ;
  local_130.line = 0x19;
  Catch::StringRef::StringRef(&local_50,"CHECK_COLUMN(result, 0, {expected_result})");
  Catch::AssertionHandler::AssertionHandler
            (&local_118,(StringRef *)local_c8,&local_130,local_50,Normal);
  duckdb::Value::Value((Value *)local_c8,local_d0);
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            (&local_88,__l,(allocator_type *)&local_151);
  bVar7 = duckdb::CHECK_COLUMN
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)&local_148,0,(vector<duckdb::Value,_true> *)&local_88);
  local_130.file = (char *)CONCAT71(local_130.file._1_7_,bVar7);
  Catch::AssertionHandler::handleExpr<bool>(&local_118,(ExprLhs<bool> *)&local_130);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_88);
  duckdb::Value::~Value((Value *)local_c8);
  Catch::AssertionHandler::complete(&local_118);
  if (local_118.m_completed == false) {
    (*(local_118.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  if (local_148._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_148._M_head_impl + 8))();
  }
  if (local_150._M_head_impl != (Appender *)0x0) {
    (**(code **)(*(long *)local_150._M_head_impl + 8))();
  }
  _Var4._M_head_impl = local_140._M_head_impl;
  if (local_140._M_head_impl != (Connection *)0x0) {
    duckdb::Connection::~Connection(local_140._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  _Var5._M_head_impl = local_120._M_head_impl;
  if (local_120._M_head_impl != (DuckDB *)0x0) {
    duckdb::DuckDB::~DuckDB(local_120._M_head_impl);
    operator_delete(_Var5._M_head_impl);
  }
  return;
}

Assistant:

void TestAppendingSingleDecimalValue(SRC value, Value expected_result, uint8_t width, uint8_t scale) {
	auto db = make_uniq<DuckDB>(nullptr);
	auto conn = make_uniq<Connection>(*db);
	duckdb::unique_ptr<Appender> appender;
	duckdb::unique_ptr<QueryResult> result;
	REQUIRE_NO_FAIL(conn->Query(StringUtil::Format("CREATE TABLE decimals(i DECIMAL(%d,%d))", width, scale)));
	appender = make_uniq<Appender>(*conn, "decimals");

	appender->BeginRow();
	appender->Append<SRC>(value);
	appender->EndRow();

	appender->Flush();

	result = conn->Query("SELECT * FROM decimals");
	REQUIRE(CHECK_COLUMN(result, 0, {expected_result}));
}